

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

void __thiscall
Am_Load_Save_Context::Am_Load_Save_Context(Am_Load_Save_Context *this,Am_Value *in_value)

{
  Am_ID_Tag AVar1;
  Am_Value *in_value_local;
  Am_Load_Save_Context *this_local;
  
  this->data = (Am_Load_Save_Context_Data *)in_value->value;
  if (this->data != (Am_Load_Save_Context_Data *)0x0) {
    AVar1 = Am_Load_Save_Context_Data::Am_Load_Save_Context_Data_ID();
    if (AVar1 != in_value->type) {
      Am_Error();
    }
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  return;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}